

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

bool vkt::image::anon_unknown_0::comparePixelBuffers
               (TestLog *log,Texture *texture,VkFormat format,ConstPixelBufferAccess *reference,
               ConstPixelBufferAccess *result)

{
  Texture *pTVar1;
  bool bVar2;
  ImageType IVar3;
  ImageType *pIVar4;
  char *pcVar5;
  char *pcVar6;
  ImageType local_29c;
  Vector<float,_4> local_284;
  Vector<unsigned_int,_4> local_274;
  bool local_261;
  undefined1 local_260 [7];
  bool ok;
  undefined1 local_238 [8];
  ConstPixelBufferAccess resultLayer;
  undefined1 local_1e8 [8];
  ConstPixelBufferAccess refLayer;
  string local_1b8;
  byte local_191;
  string local_190;
  byte local_16d;
  int local_16c;
  string local_168;
  byte local_147;
  byte local_146;
  byte local_145;
  int local_144;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string comparisonDesc;
  string local_90;
  undefined1 local_70 [8];
  string comparisonName;
  int layerNdx;
  int passedLayers;
  int numCubeFaces;
  ImageType local_38;
  byte local_32;
  byte local_31;
  int numLayersOrSlices;
  bool is3d;
  bool intFormat;
  ConstPixelBufferAccess *result_local;
  ConstPixelBufferAccess *reference_local;
  Texture *pTStack_18;
  VkFormat format_local;
  Texture *texture_local;
  TestLog *log_local;
  
  _numLayersOrSlices = result;
  result_local = reference;
  reference_local._4_4_ = format;
  pTStack_18 = texture;
  texture_local = (Texture *)log;
  local_31 = isIntegerFormat(format);
  IVar3 = Texture::type(pTStack_18);
  local_32 = IVar3 == IMAGE_TYPE_3D;
  if ((bool)local_32) {
    Texture::size((Texture *)&passedLayers);
    pIVar4 = (ImageType *)tcu::Vector<int,_3>::z((Vector<int,_3> *)&passedLayers);
    local_29c = *pIVar4;
  }
  else {
    local_29c = Texture::numLayers(pTStack_18);
  }
  local_38 = local_29c;
  comparisonName.field_2._12_4_ = 0;
  for (comparisonName.field_2._8_4_ = 0; (int)comparisonName.field_2._8_4_ < (int)local_38;
      comparisonName.field_2._8_4_ = comparisonName.field_2._8_4_ + 1) {
    de::toString<int>(&local_90,(int *)(comparisonName.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   "Comparison",&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    local_145 = 0;
    local_146 = 0;
    local_147 = 0;
    local_16d = 0;
    local_191 = 0;
    refLayer.m_data._7_1_ = 0;
    bVar2 = isCube(pTStack_18);
    if (bVar2) {
      local_144 = (int)comparisonName.field_2._8_4_ % 6;
      de::toString<int>(&local_140,&local_144);
      local_145 = 1;
      std::operator+(&local_120,"face ",&local_140);
      local_146 = 1;
      std::operator+(&local_100,&local_120,", cube ");
      local_147 = 1;
      local_16c = (int)comparisonName.field_2._8_4_ / 6;
      de::toString<int>(&local_168,&local_16c);
      local_16d = 1;
      std::operator+(&local_e0,&local_100,&local_168);
    }
    else if ((local_32 & 1) == 0) {
      de::toString<int>(&local_1b8,(int *)(comparisonName.field_2._M_local_buf + 8));
      refLayer.m_data._7_1_ = 1;
      std::operator+(&local_e0,"layer ",&local_1b8);
    }
    else {
      de::toString<int>(&local_190,(int *)(comparisonName.field_2._M_local_buf + 8));
      local_191 = 1;
      std::operator+(&local_e0,"slice ",&local_190);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   "Image Comparison, ",&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    if ((refLayer.m_data._7_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1b8);
    }
    if ((local_191 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_190);
    }
    if ((local_16d & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_168);
    }
    if ((local_147 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_100);
    }
    if ((local_146 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_120);
    }
    if ((local_145 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_140);
    }
    pTVar1 = pTStack_18;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&resultLayer.m_data,reference);
    getLayerOrSlice((ConstPixelBufferAccess *)local_1e8,pTVar1,
                    (ConstPixelBufferAccess *)&resultLayer.m_data,comparisonName.field_2._8_4_);
    pTVar1 = pTStack_18;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)local_260,result);
    getLayerOrSlice((ConstPixelBufferAccess *)local_238,pTVar1,(ConstPixelBufferAccess *)local_260,
                    comparisonName.field_2._8_4_);
    pTVar1 = texture_local;
    local_261 = false;
    if ((local_31 & 1) == 0) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      tcu::Vector<float,_4>::Vector(&local_284,0.01);
      local_261 = tcu::floatThresholdCompare
                            ((TestLog *)pTVar1,pcVar5,pcVar6,(ConstPixelBufferAccess *)local_1e8,
                             (ConstPixelBufferAccess *)local_238,&local_284,COMPARE_LOG_RESULT);
    }
    else {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      tcu::Vector<unsigned_int,_4>::Vector(&local_274,0);
      local_261 = tcu::intThresholdCompare
                            ((TestLog *)pTVar1,pcVar5,pcVar6,(ConstPixelBufferAccess *)local_1e8,
                             (ConstPixelBufferAccess *)local_238,&local_274,COMPARE_LOG_RESULT);
    }
    if (local_261 != false) {
      comparisonName.field_2._12_4_ = comparisonName.field_2._12_4_ + 1;
    }
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_70);
  }
  return comparisonName.field_2._12_4_ == local_38;
}

Assistant:

bool comparePixelBuffers (tcu::TestLog&						log,
						  const Texture&					texture,
						  const VkFormat					format,
						  const tcu::ConstPixelBufferAccess	reference,
						  const tcu::ConstPixelBufferAccess	result)
{
	DE_ASSERT(reference.getFormat() == result.getFormat());
	DE_ASSERT(reference.getSize() == result.getSize());

	const bool intFormat = isIntegerFormat(format);
	const bool is3d = (texture.type() == IMAGE_TYPE_3D);
	const int numLayersOrSlices = (is3d ? texture.size().z() : texture.numLayers());
	const int numCubeFaces = 6;

	int passedLayers = 0;
	for (int layerNdx = 0; layerNdx < numLayersOrSlices; ++layerNdx)
	{
		const std::string comparisonName = "Comparison" + de::toString(layerNdx);
		const std::string comparisonDesc = "Image Comparison, " +
			(isCube(texture) ? "face " + de::toString(layerNdx % numCubeFaces) + ", cube " + de::toString(layerNdx / numCubeFaces) :
			is3d			 ? "slice " + de::toString(layerNdx) : "layer " + de::toString(layerNdx));

		const tcu::ConstPixelBufferAccess refLayer = getLayerOrSlice(texture, reference, layerNdx);
		const tcu::ConstPixelBufferAccess resultLayer = getLayerOrSlice(texture, result, layerNdx);

		bool ok = false;
		if (intFormat)
			ok = tcu::intThresholdCompare(log, comparisonName.c_str(), comparisonDesc.c_str(), refLayer, resultLayer, tcu::UVec4(0), tcu::COMPARE_LOG_RESULT);
		else
			ok = tcu::floatThresholdCompare(log, comparisonName.c_str(), comparisonDesc.c_str(), refLayer, resultLayer, tcu::Vec4(0.01f), tcu::COMPARE_LOG_RESULT);

		if (ok)
			++passedLayers;
	}
	return passedLayers == numLayersOrSlices;
}